

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::testRunEnded
          (CumulativeReporterBase<Catch::SonarQubeReporter> *this,TestRunStats *testRunStats)

{
  long *in_RDI;
  shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>
  node;
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>
  *__x;
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  TestRunStats *in_stack_ffffffffffffffe8;
  
  __x = (vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>
         *)&stack0xffffffffffffffe0;
  std::
  make_shared<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>>>,Catch::TestRunStats_const&>
            (in_stack_ffffffffffffffe8);
  clara::std::
  __shared_ptr_access<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x166256);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>
  ::swap(in_stack_ffffffffffffffd0,__x);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>_>
  ::push_back((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>_>
               *)in_stack_ffffffffffffffd0,(value_type *)__x);
  (**(code **)(*in_RDI + 0x90))();
  clara::std::
  shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>
  ::~shared_ptr((shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>
                 *)0x16629d);
  return;
}

Assistant:

void testRunEnded(TestRunStats const& testRunStats) override {
            auto node = std::make_shared<TestRunNode>(testRunStats);
            node->children.swap(m_testGroups);
            m_testRuns.push_back(node);
            testRunEndedCumulative();
        }